

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O3

int nni_id_alloc(nni_id_map *m,uint64_t *idp,void *val)

{
  uint32_t uVar1;
  int iVar2;
  size_t sVar3;
  uint64_t uVar4;
  uint64_t id;
  ulong uVar5;
  uint64_t uVar6;
  
  if (val == (void *)0x0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/idhash.c",
              0x143,"val != NULL");
  }
  uVar6 = m->id_max_val;
  uVar4 = m->id_min_val;
  iVar2 = 2;
  if ((ulong)m->id_count <= uVar6 - uVar4) {
    uVar5 = m->id_dyn_val;
    if ((m->id_dyn_val == 0) && (uVar5 = uVar4, (m->id_flags & 2) != 0)) {
      uVar1 = nni_random();
      uVar4 = m->id_min_val;
      uVar6 = m->id_max_val;
      uVar5 = (ulong)uVar1 % ((uVar6 - uVar4) + 1) + uVar4;
    }
    do {
      id = uVar5;
      uVar5 = id + 1;
      if (uVar6 < id + 1) {
        uVar5 = uVar4;
      }
      m->id_dyn_val = uVar5;
      sVar3 = id_find(m,id);
    } while (sVar3 != 0xffffffffffffffff);
    iVar2 = nni_id_set(m,id,val);
    if (iVar2 == 0) {
      *idp = id;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
nni_id_alloc(nni_id_map *m, uint64_t *idp, void *val)
{
	uint64_t id;
	int      rv;

	NNI_ASSERT(val != NULL);

	// range is inclusive, so > to get +1 effect.
	if (m->id_count > (m->id_max_val - m->id_min_val)) {
		// Really more like ENOSPC.. the table is filled to max.
		return (NNG_ENOMEM);
	}
	if (m->id_dyn_val == 0) {
		if (m->id_flags & NNI_ID_FLAG_RANDOM) {
			// NB: The range is inclusive.
			m->id_dyn_val = nni_random() %
			        (m->id_max_val - m->id_min_val + 1) +
			    m->id_min_val;
		} else {
			m->id_dyn_val = m->id_min_val;
		}
	}

	for (;;) {
		id = m->id_dyn_val;
		m->id_dyn_val++;
		if (m->id_dyn_val > m->id_max_val) {
			m->id_dyn_val = m->id_min_val;
		}

		if (id_find(m, id) == (size_t) -1) {
			break;
		}
	}

	rv = nni_id_set(m, id, val);
	if (rv == 0) {
		*idp = id;
	}
	return (rv);
}